

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

Builder * __thiscall
arangodb::velocypack::Builder::closeArray
          (Builder *this,ValueLength pos,iterator indexStart,iterator indexEnd)

{
  ValueLength *pVVar1;
  unsigned_long *puVar2;
  Options *options;
  bool bVar3;
  ValueLength subLen;
  long lVar4;
  byte bVar5;
  ValueLength VVar6;
  ValueLength VVar7;
  ulong uVar8;
  size_t __n;
  unsigned_long uVar9;
  byte *start;
  uint uVar10;
  long lVar11;
  ValueLength VVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong v;
  bool bVar17;
  bool bVar18;
  
  lVar13 = (long)indexEnd._M_current - (long)indexStart._M_current;
  v = lVar13 >> 3;
  VVar6 = this->_pos;
  if (lVar13 == 8) {
    bVar17 = false;
  }
  else {
    lVar14 = indexStart._M_current[1] - *indexStart._M_current;
    bVar17 = true;
    if (((VVar6 - *indexStart._M_current) - pos == lVar14 * v) &&
       (VVar6 - (indexStart._M_current[v - 1] + pos) == lVar14)) {
      uVar16 = 1;
      do {
        bVar17 = uVar16 < v - 1;
        if (!bVar17) break;
        lVar4 = uVar16 + 1;
        puVar2 = indexStart._M_current + uVar16;
        uVar16 = uVar16 + 1;
      } while (indexStart._M_current[lVar4] - *puVar2 == lVar14);
    }
  }
  options = this->options;
  start = this->_start + pos;
  bVar3 = anon_unknown.dwarf_a6c3::isAllowedToMemmove(options,start,indexStart,indexEnd,1);
  lVar14 = VVar6 - pos;
  VVar6 = 0;
  if (bVar17 != false) {
    VVar6 = v;
  }
  lVar4 = (ulong)bVar17 - 7;
  if (!bVar3) {
    lVar4 = 0;
  }
  bVar18 = bVar17;
  if (VVar6 + lVar14 + lVar4 < 0x100) {
    uVar10 = 1;
LAB_00105234:
    if (bVar18 == false) {
      bVar18 = options->paddingBehavior == UsePadding;
      if (bVar18) goto LAB_00105294;
      bVar3 = (bool)(bVar3 & !bVar18);
    }
    bVar5 = bVar17 * '\x04' | 2;
    if (uVar10 == 4) {
      *start = bVar5 + 2;
      uVar16 = 4;
      uVar10 = 4;
    }
    else if (uVar10 == 2) {
      uVar16 = 2;
      *start = bVar17 * '\x04' | 3;
      uVar10 = 2;
    }
    else {
      uVar16 = (ulong)uVar10;
      *start = bVar5;
    }
    if (bVar3 != false) {
      uVar15 = 0;
      if (bVar17 == false) {
        uVar15 = uVar16;
      }
      lVar13 = ((ulong)uVar10 * 2 + 1) - uVar15;
      uVar15 = this->_pos;
      __n = uVar15 - (pos + 9);
      if (pos + 9 <= uVar15 && __n != 0) {
        memmove(this->_start + lVar13 + pos,this->_start + pos + 9,__n);
        uVar15 = this->_pos;
      }
      lVar13 = 9 - lVar13;
      this->_pos = uVar15 - lVar13;
      pVVar1 = &this->_bufferPtr->_size;
      *pVVar1 = *pVVar1 - lVar13;
      if (bVar17 == false) goto LAB_001053ea;
      for (VVar6 = 0; v != VVar6; VVar6 = VVar6 + 1) {
        indexStart._M_current[VVar6] = indexStart._M_current[VVar6] - lVar13;
      }
    }
  }
  else {
    bVar3 = anon_unknown.dwarf_a6c3::isAllowedToMemmove(options,start,indexStart,indexEnd,2);
    lVar4 = lVar13 >> 2;
    if (bVar17 == false) {
      lVar4 = 0;
    }
    lVar11 = (ulong)bVar17 * 2 + -6;
    if (!bVar3) {
      lVar11 = 0;
    }
    if ((ulong)(lVar11 + lVar4 + lVar14) < 0x10000) {
      uVar10 = 2;
      goto LAB_00105234;
    }
    lVar4 = 0;
    if (bVar17 != false) {
      lVar4 = lVar13 >> 1;
    }
    bVar18 = (ulong)(lVar14 + lVar4) >> 0x20 == 0;
    if (bVar18) {
      uVar10 = 4;
      bVar3 = false;
      bVar18 = (bool)(!bVar18 | bVar17);
      goto LAB_00105234;
    }
LAB_00105294:
    uVar10 = 8;
    *start = bVar17 * '\x04' + 5;
    uVar16 = 8;
  }
  if (bVar17 != false) {
    lVar13 = v * uVar16;
    reserve(this,(ulong)(uVar10 == 8) * 8 + lVar13);
    VVar6 = this->_pos;
    this->_pos = VVar6 + lVar13;
    pVVar1 = &this->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + lVar13;
    for (VVar7 = 0; VVar7 != v; VVar7 = VVar7 + 1) {
      uVar9 = indexStart._M_current[VVar7];
      VVar12 = VVar6;
      uVar15 = uVar16;
      while (bVar3 = uVar15 != 0, uVar15 = uVar15 - 1, bVar3) {
        this->_start[VVar12] = (uint8_t)uVar9;
        uVar9 = uVar9 >> 8;
        VVar12 = VVar12 + 1;
      }
      VVar6 = VVar6 + uVar16;
    }
    if (bVar17 == true && uVar10 == 8) {
      reserve(this,8);
      appendLengthUnchecked<8ul>(this,v);
      uVar10 = 8;
    }
  }
LAB_001053ea:
  uVar8 = this->_pos - pos;
  uVar15 = (ulong)uVar10;
  VVar6 = pos;
  while (bVar3 = uVar15 != 0, uVar15 = uVar15 - 1, bVar3) {
    this->_start[VVar6 + 1] = (uint8_t)uVar8;
    uVar8 = uVar8 >> 8;
    VVar6 = VVar6 + 1;
  }
  if (bVar17 == true && uVar10 < 8) {
    for (; uVar16 < uVar10 * 2; uVar16 = uVar16 + 1) {
      this->_start[uVar16 + pos + 1] = (uint8_t)v;
      v = v >> 8;
    }
  }
  closeLevel(this);
  return this;
}

Assistant:

Builder& Builder::closeArray(ValueLength pos,
                             std::vector<ValueLength>::iterator indexStart,
                             std::vector<ValueLength>::iterator indexEnd) {
  std::size_t const n = std::distance(indexStart, indexEnd);
  VELOCYPACK_ASSERT(n > 0);

  bool needIndexTable = true;
  bool needNrSubs = true;

  if (n == 1) {
    // just one array entry
    needIndexTable = false;
    needNrSubs = false;
  } else if ((_pos - pos) - indexStart[0] ==
             n * (indexStart[1] - indexStart[0])) {
    // In this case it could be that all entries have the same length
    // and we do not need an offset table at all:
    bool buildIndexTable = false;
    ValueLength const subLen = indexStart[1] - indexStart[0];
    if ((_pos - pos) - indexStart[n - 1] != subLen) {
      buildIndexTable = true;
    } else {
      for (std::size_t i = 1; i < n - 1; i++) {
        if (indexStart[i + 1] - indexStart[i] != subLen) {
          // different lengths
          buildIndexTable = true;
          break;
        }
      }
    }

    if (!buildIndexTable) {
      needIndexTable = false;
      needNrSubs = false;
    }
  }

  VELOCYPACK_ASSERT(needIndexTable == needNrSubs);

  // First determine byte length and its format:
  unsigned int offsetSize;
  // can be 1, 2, 4 or 8 for the byte width of the offsets,
  // the byte length and the number of subvalues:
  bool allowMemmove =
      ::isAllowedToMemmove(options, _start + pos, indexStart, indexEnd, 1);
  if (_pos - pos + (needIndexTable ? n : 0) -
          (allowMemmove ? (needNrSubs ? 6 : 7) : 0) <=
      0xff) {
    // We have so far used _pos - pos bytes, including the reserved 8
    // bytes for byte length and number of subvalues. In the 1-byte number
    // case we would win back 6 bytes but would need one byte per subvalue
    // for the index table
    offsetSize = 1;
  } else {
    allowMemmove =
        ::isAllowedToMemmove(options, _start + pos, indexStart, indexEnd, 2);
    if (_pos - pos + (needIndexTable ? 2 * n : 0) -
            (allowMemmove ? (needNrSubs ? 4 : 6) : 0) <=
        0xffff) {
      offsetSize = 2;
    } else {
      allowMemmove = false;
      if (_pos - pos + (needIndexTable ? 4 * n : 0) <= 0xffffffffu) {
        offsetSize = 4;
      } else {
        offsetSize = 8;
      }
    }
  }

  VELOCYPACK_ASSERT(offsetSize == 1 || offsetSize == 2 || offsetSize == 4 ||
                    offsetSize == 8);
  VELOCYPACK_ASSERT(!allowMemmove || offsetSize == 1 || offsetSize == 2);

  if (offsetSize < 8 && !needIndexTable &&
      options->paddingBehavior == Options::PaddingBehavior::UsePadding) {
    // if we are allowed to use padding, we will pad to 8 bytes anyway. as we
    // are not using an index table, we can also use type 0x05 for all Arrays
    // without making things worse space-wise
    offsetSize = 8;
    allowMemmove = false;
  }

  // fix head byte
  _start[pos] = ::determineArrayType(needIndexTable, offsetSize);

  // Maybe we need to move down data:
  if (allowMemmove) {
    // check if one of the first entries in the array is ValueType::None
    // (0x00). in this case, we could not distinguish between a None (0x00)
    // and the optional padding. so we must prevent the memmove here
    ValueLength targetPos = 1 + 2 * offsetSize;
    if (!needIndexTable) {
      targetPos -= offsetSize;
    }
    if (_pos > (pos + 9)) {
      ValueLength len = _pos - (pos + 9);
      memmove(_start + pos + targetPos, _start + pos + 9, checkOverflow(len));
    }
    ValueLength const diff = 9 - targetPos;
    rollback(diff);
    if (needIndexTable) {
      for (std::size_t i = 0; i < n; i++) {
        indexStart[i] -= diff;
      }
    }  // Note: if !needIndexTable the index array is now wrong!
  }

  // Now build the table:
  if (needIndexTable) {
    reserve(offsetSize * n + (offsetSize == 8 ? 8 : 0));
    ValueLength tableBase = _pos;
    advance(offsetSize * n);
    for (std::size_t i = 0; i < n; i++) {
      uint64_t x = indexStart[i];
      for (std::size_t j = 0; j < offsetSize; j++) {
        _start[tableBase + offsetSize * i + j] = x & 0xff;
        x >>= 8;
      }
    }
  }

  // Finally fix the byte width at tthe end:
  if (offsetSize == 8 && needNrSubs) {
    reserve(8);
    appendLengthUnchecked<8>(n);
  }

  // Fix the byte length in the beginning:
  ValueLength x = _pos - pos;
  for (unsigned int i = 1; i <= offsetSize; i++) {
    _start[pos + i] = x & 0xff;
    x >>= 8;
  }

  if (offsetSize < 8 && needNrSubs) {
    x = n;
    for (unsigned int i = offsetSize + 1; i <= 2 * offsetSize; i++) {
      _start[pos + i] = x & 0xff;
      x >>= 8;
    }
  }

  // Now the array or object is complete, we pop a ValueLength
  // off the _stack:
  closeLevel();
  return *this;
}